

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

bool __thiscall Minisat::SimpSolver::addClause_(SimpSolver *this,vec<Minisat::Lit,_int> *ps)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint elem;
  uint *puVar4;
  bool bVar5;
  ulong uVar6;
  CRef cr;
  uint local_34;
  
  iVar2 = (this->super_Solver).clauses.sz;
  if ((this->use_rcheck == true) && (bVar5 = implied(this,ps), bVar5)) {
    return true;
  }
  bVar5 = Solver::addClause_(&this->super_Solver,ps);
  if (bVar5) {
    bVar5 = true;
    if ((this->use_simplification == true) &&
       (iVar3 = (this->super_Solver).clauses.sz, iVar3 == iVar2 + 1)) {
      elem = (this->super_Solver).clauses.data[(long)iVar3 + -1];
      puVar4 = (this->super_Solver).ca.ra.memory;
      Queue<unsigned_int>::insert(&this->subsumption_queue,elem);
      if (0x1f < puVar4[elem]) {
        puVar4 = puVar4 + elem;
        uVar6 = 0;
        do {
          vec<unsigned_int,_int>::push
                    ((this->occurs).occs.map.data + ((int)puVar4[uVar6 + 1] >> 1),&local_34);
          piVar1 = (this->n_occ).super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>.map.data +
                   (int)puVar4[uVar6 + 1];
          *piVar1 = *piVar1 + 1;
          (this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data
          [(int)puVar4[uVar6 + 1] >> 1] = '\x01';
          this->n_touched = this->n_touched + 1;
          if (((int)puVar4[uVar6 + 1] >> 1 < (this->elim_heap).indices.map.sz) &&
             (iVar2 = (this->elim_heap).indices.map.data[(int)puVar4[uVar6 + 1] >> 1], -1 < iVar2))
          {
            Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::percolateDown
                      (&this->elim_heap,iVar2);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < *puVar4 >> 5);
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool SimpSolver::addClause_(vec<Lit>& ps)
{
#ifndef NDEBUG
    for (int i = 0; i < ps.size(); i++)
        assert(!isEliminated(var(ps[i])));
#endif

    int nclauses = clauses.size();

    if (use_rcheck && implied(ps))
        return true;

    if (!Solver::addClause_(ps))
        return false;

    if (use_simplification && clauses.size() == nclauses + 1){
        CRef          cr = clauses.last();
        const Clause& c  = ca[cr];

        // NOTE: the clause is added to the queue immediately and then
        // again during 'gatherTouchedClauses()'. If nothing happens
        // in between, it will only be checked once. Otherwise, it may
        // be checked twice unnecessarily. This is an unfortunate
        // consequence of how backward subsumption is used to mimic
        // forward subsumption.
        subsumption_queue.insert(cr);
        for (int i = 0; i < c.size(); i++){
            occurs[var(c[i])].push(cr);
            n_occ[c[i]]++;
            touched[var(c[i])] = 1;
            n_touched++;
            if (elim_heap.inHeap(var(c[i])))
                elim_heap.increase(var(c[i]));
        }
    }

    return true;
}